

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O1

ExpressionValue *
expFuncFileSize(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
               vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  bool bVar1;
  uintmax_t uVar2;
  StringLiteral *fileName;
  error_code error;
  path fullName;
  StringLiteral *local_58;
  path local_50;
  path local_30;
  
  bVar1 = getExpFuncParameter(parameters,0,&local_58,funcName,false);
  if (bVar1) {
    StringLiteral::path(&local_50,local_58);
    getFullPathName(&local_30,&local_50);
    ghc::filesystem::path::~path(&local_50);
    local_50._path._M_dataplus._M_p._0_4_ = 0;
    local_50._path._M_string_length = std::_V2::system_category();
    uVar2 = ghc::filesystem::file_size(&local_30,(error_code *)&local_50);
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
    (__return_storage_ptr__->strValue)._value._M_string_length = 0;
    (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->type = Integer;
    (__return_storage_ptr__->field_1).intValue = uVar2;
    ghc::filesystem::path::~path(&local_30);
  }
  else {
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
    (__return_storage_ptr__->strValue)._value._M_string_length = 0;
    (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->type = Invalid;
    (__return_storage_ptr__->field_1).intValue = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncFileSize(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	const StringLiteral* fileName;
	GET_PARAM(parameters,0,fileName);

	auto fullName = getFullPathName(fileName->path());

	std::error_code error;
	return ExpressionValue(static_cast<int64_t>(fs::file_size(fullName, error)));
}